

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringHelper.cpp
# Opt level: O3

void __thiscall
phpconvert::StringHelper::regexReplace(StringHelper *this,string *target,string *from,string *to)

{
  pointer pcVar1;
  match_flag_type in_R9D;
  regex re;
  undefined1 auStack_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)auStack_68
             ,from,0);
  pcVar1 = (to->_M_dataplus)._M_p;
  local_58._M_allocated_capacity = (size_type)local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(auStack_68 + 0x10),pcVar1,pcVar1 + to->_M_string_length);
  boost::
  regex_replace<boost::regex_traits<char,boost::cpp_regex_traits<char>>,char,std::__cxx11::string>
            (&local_38,(boost *)target,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68,
             (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             (auStack_68 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2000000,in_R9D);
  std::__cxx11::string::operator=((string *)target,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((undefined1 *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity);
  }
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_68 + 8));
  return;
}

Assistant:

void StringHelper::regexReplace(string& target, string& from, string& to) {
	boost::regex re(from);
	target = boost::regex_replace(target, re, to,
			boost::match_default | boost::format_all);
}